

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void getEnv(char *name,uint nameLength,char **value,uint *valueLength)

{
  char *__s;
  size_t sVar1;
  char *__dest;
  uint uVar2;
  
  if (name != (char *)0x0 && value != (char **)0x0) {
    __s = getenv(name);
    if (__s != (char *)0x0) {
      sVar1 = strlen(__s);
      uVar2 = (uint)sVar1;
      if (uVar2 != 0) {
        __dest = (char *)malloc((ulong)(uVar2 + 1));
        *value = __dest;
        memcpy(__dest,__s,sVar1 & 0xffffffff);
        __dest[sVar1 & 0xffffffff] = '\0';
        if (valueLength == (uint *)0x0) {
          return;
        }
        goto LAB_001036f8;
      }
    }
    *value = (char *)0x0;
  }
  if (valueLength == (uint *)0x0) {
    return;
  }
  uVar2 = 0;
LAB_001036f8:
  *valueLength = uVar2;
  return;
}

Assistant:

void getEnv(const char * name, unsigned int nameLength, char ** value, unsigned int * valueLength)
{
    (void)nameLength;

    if (name == 0x0 || value == 0x0)
    {
        if (valueLength != 0x0)
        {
            *valueLength = 0;
        }

        return;
    }

    const char * systemValue = getenv(name);

    if (systemValue == 0x0)
    {
        invalidateStringOutParameter(value, valueLength);
        return;
    }

    unsigned int systemValueLength = (unsigned int)strlen(systemValue);

    if (systemValueLength == 0)
    {
        invalidateStringOutParameter(value, valueLength);
        return;
    }

    copyToStringOutParameter(systemValue, systemValueLength, value, valueLength);
}